

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Model::Clear(Model *this)

{
  if (this->description_ != (ModelDescription *)0x0) {
    (*(this->description_->super_MessageLite)._vptr_MessageLite[1])();
  }
  *(undefined8 *)((long)&this->description_ + 5) = 0;
  this->description_ = (ModelDescription *)0x0;
  clear_Type(this);
  return;
}

Assistant:

void Model::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.Model)
  if (GetArenaNoVirtual() == NULL && description_ != NULL) {
    delete description_;
  }
  description_ = NULL;
  ::memset(&specificationversion_, 0, reinterpret_cast<char*>(&isupdatable_) -
    reinterpret_cast<char*>(&specificationversion_) + sizeof(isupdatable_));
  clear_Type();
}